

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall
slang::parsing::Lexer::scanDisabledRegion
          (Lexer *this,string_view firstWord,string_view secondWord,
          optional<std::basic_string_view<char,_std::char_traits<char>_>_> thirdWord,
          DiagCode unclosedDiag)

{
  string_view word;
  string_view word_00;
  string_view word_01;
  string_view arg;
  char cVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  Lexer *in_RDI;
  anon_class_8_1_8991fb9c *in_R8;
  DiagCode in_R9D;
  bool isBlockComment;
  Diagnostic *diag;
  char c;
  anon_class_8_1_8991fb9c matchWord;
  Lexer *this_00;
  Lexer *in_stack_ffffffffffffff60;
  Lexer *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  DiagCode code;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff78;
  size_t sVar4;
  char *pcVar5;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  
  this_00 = (Lexer *)&stack0x00000008;
  do {
    do {
      do {
        cVar1 = peek(in_RDI);
        if (cVar1 == '\0') {
          bVar2 = reallyAtEnd(in_RDI);
          code = SUB84(in_stack_ffffffffffffff70 >> 0x20,0);
          if (bVar2) {
            currentOffset(in_RDI);
            lexemeLength(in_RDI);
            addDiag(in_stack_ffffffffffffff68,code,(size_t)in_stack_ffffffffffffff60);
            bVar2 = slang::operator==(in_R9D,(DiagCode)0x100002);
            if (!bVar2) {
              return;
            }
            arg._M_str = (char *)in_R8;
            arg._M_len = in_RCX;
            Diagnostic::operator<<
                      ((Diagnostic *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       arg);
            return;
          }
        }
        advance(in_RDI);
      } while ((cVar1 != '/') ||
              ((cVar1 = peek(in_RDI), cVar1 != '/' && (cVar1 = peek(in_RDI), cVar1 != '*'))));
      cVar1 = peek(in_RDI);
      in_stack_ffffffffffffff97 = cVar1 == '*';
      advance(in_RDI);
      word._M_str = in_RDX;
      word._M_len = in_RSI;
      sVar4 = in_RSI;
      pcVar5 = in_RDX;
      bVar2 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()
                        (in_stack_ffffffffffffff78,word);
    } while ((!bVar2) ||
            (word_00._M_str = pcVar5, word_00._M_len = sVar4, in_stack_ffffffffffffff70 = in_RCX,
            in_stack_ffffffffffffff78 = in_R8,
            bVar2 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()(in_R8,word_00), !bVar2))
    ;
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x885b00)
    ;
    if (!bVar2) break;
    pbVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                       ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x885b10
                       );
    in_stack_ffffffffffffff60 = (Lexer *)pbVar3->_M_len;
    in_stack_ffffffffffffff68 = (Lexer *)pbVar3->_M_str;
    word_01._M_str = pcVar5;
    word_01._M_len = sVar4;
    bVar2 = scanDisabledRegion::anon_class_8_1_8991fb9c::operator()
                      (in_stack_ffffffffffffff78,word_01);
  } while (!bVar2);
  if ((in_stack_ffffffffffffff97 & 1) == 0) {
    scanLineComment(this_00);
  }
  else {
    scanBlockComment(in_stack_ffffffffffffff60);
  }
  SmallVectorBase<slang::parsing::Trivia>::pop_back
            ((SmallVectorBase<slang::parsing::Trivia> *)this_00);
  return;
}

Assistant:

void Lexer::scanDisabledRegion(std::string_view firstWord, std::string_view secondWord,
                               std::optional<std::string_view> thirdWord, DiagCode unclosedDiag) {
    auto matchWord = [&](std::string_view word) {
        while (isTabOrSpace(peek()))
            advance();

        for (char c : word) {
            if (!consume(c))
                return false;
        }

        char c = peek();
        return isWhitespace(c) || c == '\0';
    };

    while (true) {
        char c = peek();
        if (c == '\0' && reallyAtEnd()) {
            auto& diag = addDiag(unclosedDiag, currentOffset() - lexemeLength());
            if (unclosedDiag == diag::UnclosedTranslateOff)
                diag << secondWord;
            return;
        }

        advance();
        if (c == '/' && (peek() == '/' || peek() == '*')) {
            const bool isBlockComment = peek() == '*';
            advance();

            if (matchWord(firstWord) && matchWord(secondWord)) {
                if (!thirdWord || matchWord(*thirdWord)) {
                    // Scan the rest of the comment and then return.
                    // We discard the comment trivia from the buffer
                    // so that this part of the region ends up as
                    // a DisabledText trivia instead.
                    if (isBlockComment)
                        scanBlockComment();
                    else
                        scanLineComment();
                    triviaBuffer.pop_back();
                    return;
                }
            }
        }
    }
}